

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall CPU::MOS6502::State::Registers::Registers(Registers *this)

{
  bool bVar1;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  Registers *local_10;
  Registers *this_local;
  
  local_10 = this;
  Reflection::StructImpl<CPU::MOS6502::State::Registers>::StructImpl
            (&this->super_StructImpl<CPU::MOS6502::State::Registers>);
  (this->super_StructImpl<CPU::MOS6502::State::Registers>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00ca9468;
  bVar1 = Reflection::StructImpl<CPU::MOS6502::State::Registers>::needs_declare
                    (&this->super_StructImpl<CPU::MOS6502::State::Registers>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"program_counter",&local_41);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->program_counter,
               &local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"stack_pointer",&local_69);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->stack_pointer,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"flags",&local_91);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->flags,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"a",&local_b9);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->a,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"x",&local_e1);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->x,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"y",&local_109);
    Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::Registers>,&this->y,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  return;
}

Assistant:

State::Registers::Registers() {
	if(needs_declare()) {
		DeclareField(program_counter);
		DeclareField(stack_pointer);
		DeclareField(flags);
		DeclareField(a);
		DeclareField(x);
		DeclareField(y);
	}
}